

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O3

void __thiscall Printer_printEmptyReset_Test::TestBody(Printer_printEmptyReset_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  char *pcVar3;
  string a;
  ComponentPtr c;
  AssertionResult gtest_ar;
  ModelPtr m;
  string e;
  PrinterPtr printer;
  ResetPtr r;
  long *local_d0;
  AssertHelper local_c8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  shared_ptr *local_a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_98;
  long local_90 [2];
  internal local_80 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  string local_70 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  bool local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,
             "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n  <component>\n    <reset/>\n  </component>\n</model>\n"
             ,"");
  paVar1 = &local_c0.field_2;
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"");
  pcVar3 = "";
  local_a0 = (shared_ptr *)local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"","");
  createModelWithComponent(local_70,(string *)&local_c0);
  if (local_a0 != (shared_ptr *)local_90) {
    operator_delete(local_a0,local_90[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  libcellml::ComponentEntity::component((ulong)&local_a0);
  libcellml::Reset::create();
  libcellml::Component::addReset(local_a0);
  libcellml::Printer::create();
  libcellml::Printer::printModel_abi_cxx11_((shared_ptr *)&local_c0,local_40);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            (local_80,"e","a",&local_60,&local_c0);
  if (local_80[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d0);
    if (local_78.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = ((local_78.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/printer/printer.cpp"
               ,0x9b,pcVar3);
    testing::internal::AssertHelper::operator=(local_c8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(local_c8);
    if (local_d0 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_d0 != (long *)0x0)) {
        (**(code **)(*local_d0 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  if (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_98);
  }
  if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TEST(Printer, printEncapsulation)
{
    const std::string e_parent =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n"
        "  <component/>\n"
        "  <component/>\n"
        "  <encapsulation>\n"
        "    <component_ref>\n"
        "      <component_ref/>\n"
        "    </component_ref>\n"
        "  </encapsulation>\n"
        "</model>\n";

    libcellml::ModelPtr model = libcellml::Model::create();
    libcellml::ComponentPtr parent = libcellml::Component::create();
    libcellml::ComponentPtr child = libcellml::Component::create();
    parent->addComponent(child);

    model->addComponent(parent);

    libcellml::PrinterPtr printer = libcellml::Printer::create();
    const std::string a_parent = printer->printModel(model);
    EXPECT_EQ(e_parent, a_parent);
}